

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O0

string * __thiscall
RtMidi::getApiDisplayName_abi_cxx11_(string *__return_storage_ptr__,RtMidi *this,Api api)

{
  char *__s;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  int local_14;
  string *psStack_10;
  Api api_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if ((local_14 < 0) || (5 < local_14)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else {
    __s = rtmidi_api_names[(ulong)this & 0xffffffff][1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,local_25);
    std::allocator<char>::~allocator(local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RtMidi :: getApiDisplayName( RtMidi::Api api )
{
  if (api < 0 || api >= RtMidi::NUM_APIS)
    return "Unknown";
  return rtmidi_api_names[api][1];
}